

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O0

string * __thiscall font2svg::glyph::labelpts_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  ostream *poVar1;
  int local_50;
  int i;
  allocator<char> local_39;
  string local_38 [32];
  glyph *local_18;
  glyph *this_local;
  
  local_18 = this;
  this_local = (glyph *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
  std::__cxx11::stringstream::str((string *)&this->tmp);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  for (local_50 = 0; local_50 < (this->ftoutline).n_points; local_50 = local_50 + 1) {
    std::operator<<((ostream *)&this->field_0x270,
                    "\n <g font-family=\'SVGFreeSansASCII,sans-serif\' font-size=\'10\'>\n");
    std::operator<<((ostream *)&this->field_0x270,"  <text id=\'revision\'");
    poVar1 = std::operator<<((ostream *)&this->field_0x270," x=\'");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->ftpoints[local_50].x + 5);
    std::operator<<(poVar1,"\'");
    poVar1 = std::operator<<((ostream *)&this->field_0x270," y=\'");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->ftpoints[local_50].y + -5);
    std::operator<<(poVar1,"\'");
    std::operator<<((ostream *)&this->field_0x270," stroke=\'none\' fill=\'darkgreen\'>\n");
    poVar1 = std::operator<<((ostream *)&this->field_0x270,"  ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->ftpoints[local_50].x);
    poVar1 = std::operator<<(poVar1,",");
    std::ostream::operator<<(poVar1,this->ftpoints[local_50].y);
    std::operator<<((ostream *)&this->field_0x270,"  </text>\n");
    std::operator<<((ostream *)&this->field_0x270," </g>\n");
  }
  std::__cxx11::stringstream::str();
  return __return_storage_ptr__;
}

Assistant:

std::string labelpts() {
		tmp.str("");
		for ( int i = 0 ; i < ftoutline.n_points ; i++ ) {
			tmp << "\n <g font-family='SVGFreeSansASCII,sans-serif' font-size='10'>\n";
			tmp << "  <text id='revision'";
			tmp << " x='" << ftpoints[i].x + 5 << "'";
			tmp << " y='" << ftpoints[i].y - 5 << "'";
			tmp << " stroke='none' fill='darkgreen'>\n";
			tmp << "  " << ftpoints[i].x  << "," << ftpoints[i].y;
			tmp << "  </text>\n";
			tmp << " </g>\n";
		}
		return tmp.str();
	}